

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

void luaD_reallocstack(lua_State *L,int newsize)

{
  TValue *oldstack_00;
  StkId pTVar1;
  int local_24;
  int lim;
  TValue *oldstack;
  int newsize_local;
  lua_State *L_local;
  
  oldstack_00 = L->stack;
  local_24 = L->stacksize;
  pTVar1 = (StkId)luaM_realloc_(L,L->stack,(long)L->stacksize << 4,(long)newsize << 4);
  L->stack = pTVar1;
  for (; local_24 < newsize; local_24 = local_24 + 1) {
    L->stack[local_24].tt_ = 0;
  }
  L->stacksize = newsize;
  L->stack_last = L->stack + (long)newsize + -5;
  correctstack(L,oldstack_00);
  return;
}

Assistant:

int luaD_reallocstack (lua_State *L, int newsize, int raiseerror) {
  int lim = L->stacksize;
  StkId newstack = luaM_reallocvector(L, L->stack, lim, newsize, StackValue);
  lua_assert(newsize <= LUAI_MAXSTACK || newsize == ERRORSTACKSIZE);
  lua_assert(L->stack_last - L->stack == L->stacksize - EXTRA_STACK);
  if (unlikely(newstack == NULL)) {  /* reallocation failed? */
    if (raiseerror)
      luaM_error(L);
    else return 0;  /* do not raise an error */
  }
  for (; lim < newsize; lim++)
    setnilvalue(s2v(newstack + lim)); /* erase new segment */
  correctstack(L, L->stack, newstack);
  L->stack = newstack;
  L->stacksize = newsize;
  L->stack_last = L->stack + newsize - EXTRA_STACK;
  return 1;
}